

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O2

void __thiscall
Impl2T<poly::virtual_cloning_policy>::Impl2T
          (Impl2T<poly::virtual_cloning_policy> *this,Impl2T<poly::virtual_cloning_policy> *o)

{
  __atomic_base<unsigned_long> _Var1;
  
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR___cxa_pure_virtual_002c1838;
  LOCK();
  UNLOCK();
  _Var1._M_i = (Interface::last_id.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
  (this->super_Interface).my_id = (size_t)Interface::last_id.super___atomic_base<unsigned_long>._M_i
  ;
  Interface::last_id.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var1._M_i;
  (this->super_Interface).throw_on_copy_construction = false;
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR_function_002c1870;
  poly::vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::vector
            (&this->v,&o->v);
  (this->p)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (o->p)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  (o->p)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
  (this->cookie).cookie = 0xdeadbeef;
  return;
}

Assistant:

Impl2T(Impl2T&& o) noexcept
        : v { std::move(o.v) }
        , p { std::move(o.p) }
    {
        cookie.set();
    }